

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actorptrselect.cpp
# Opt level: O2

void VerifyTargetChain(AActor *self,bool preciseMissileCheck)

{
  bool bVar1;
  AActor *this;
  AActor *pAVar2;
  TObjPtr<AActor> *obj;
  AActor *pAVar3;
  
  if ((self != (AActor *)0x0) && (bVar1 = AActor::isMissile(self,preciseMissileCheck), bVar1)) {
    obj = &self->target;
    pAVar3 = self;
    while ((this = GC::ReadBarrier<AActor>((AActor **)obj), this != (AActor *)0x0 &&
           (bVar1 = AActor::isMissile(this,preciseMissileCheck), pAVar2 = self, bVar1))) {
      while( true ) {
        if (pAVar2 == this) {
          (self->target).field_0.p = (AActor *)0x0;
          return;
        }
        if (pAVar2 == pAVar3) break;
        pAVar2 = GC::ReadBarrier<AActor>((AActor **)&pAVar2->target);
      }
      obj = &this->target;
      pAVar3 = this;
    }
  }
  return;
}

Assistant:

void VerifyTargetChain(AActor *self, bool preciseMissileCheck)
{
	if (!self || !self->isMissile(preciseMissileCheck)) return;

	AActor *origin = self;
	AActor *next = origin->target;

	// origin: the most recent actor that has been verified as appearing only once
	// next: the next actor to be verified; will be "origin" in the next iteration

	while (next && next->isMissile(preciseMissileCheck)) // we only care when there are missiles involved
	{
		AActor *compare = self;
		// every new actor must prove not to be the first actor in the chain, or any subsequent actor
		// any actor up to and including "origin" has only appeared once
		for (;;)
 		{
			if (compare == next)
			{
				// if any of the actors from self to (inclusive) origin match the next actor,
				// self has reached/created a loop
				self->target = NULL;
				return;
			}
			if (compare == origin) break; // when "compare" = origin, we know that the next actor is, and should be "next"
			compare = compare->target;
		}

		origin = next;
		next = next->target;
	}
}